

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BottomLevelASVkImpl::BottomLevelASVkImpl
          (BottomLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,BottomLevelASDesc *Desc)

{
  pointer *this_00;
  VulkanMemoryAllocation *rhs;
  value_type vVar1;
  BLASTriangleDesc *pBVar2;
  BLASBoundingBoxDesc *pBVar3;
  PFN_vkGetPhysicalDeviceFormatProperties2KHR p_Var4;
  uint uVar5;
  bool bVar6;
  VkFormat VVar7;
  VkIndexType VVar8;
  VkBuildAccelerationStructureFlagsKHR VVar9;
  VulkanLogicalDevice *this_01;
  VulkanPhysicalDevice *this_02;
  GraphicsAdapterInfo *pGVar10;
  size_type sVar11;
  reference pvVar12;
  Char *pCVar13;
  reference pvVar14;
  VkPhysicalDevice pVVar15;
  uint *pMaxPrimitiveCounts;
  VkBuffer_T *pVVar16;
  type tVar17;
  VkAccelerationStructureKHR_T *AS;
  VkDeviceAddress VVar18;
  char (*in_stack_fffffffffffffb48) [27];
  char (*in_stack_fffffffffffffb68) [35];
  AccelStructWrapper local_370;
  undefined1 auStack_358 [8];
  VkAccelerationStructureCreateInfoKHR vkAccelStrCI;
  char *local_310;
  VkResult local_304;
  VkDeviceMemory pVStack_300;
  VkResult err;
  VkDeviceMemory Memory;
  string msg_7;
  undefined1 local_2c0 [8];
  string msg_6;
  undefined1 auStack_298 [4];
  uint32_t MemoryTypeIndex;
  VkMemoryRequirements MemReqs;
  undefined1 auStack_268 [8];
  VkBufferCreateInfo vkBuffCI;
  string msg_5;
  string msg_4;
  string msg_3;
  VkAccelerationStructureGeometryAabbsDataKHR *box;
  value_type *dst_1;
  BLASBoundingBoxDesc *src_1;
  uint32_t i_1;
  Uint32 MaxBoxCount;
  string msg_2;
  undefined1 local_188 [8];
  string msg_1;
  VkFormatProperties2 vkProps;
  string msg;
  VkAccelerationStructureGeometryTrianglesDataKHR *tri;
  value_type *dst;
  BLASTriangleDesc *src;
  uint32_t i;
  Uint32 MaxPrimitiveCount;
  VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo;
  undefined1 local_d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> MaxPrimitiveCounts;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  Uint64 AccelStructSize;
  RayTracingProperties *RTProps;
  VulkanPhysicalDevice *PhysicalDevice;
  VulkanLogicalDevice *LogicalDevice;
  BottomLevelASDesc *Desc_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  BottomLevelASVkImpl *this_local;
  
  BottomLevelASBase<Diligent::EngineVkImplTraits>::BottomLevelASBase
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,Desc,false);
  (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
  .super_ObjectBase<Diligent::IBottomLevelASVk>.super_RefCountedObject<Diligent::IBottomLevelASVk>.
  super_IBottomLevelASVk.super_IBottomLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_010cdeb8;
  this->m_DeviceAddress = 0;
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  VulkanObjectWrapper(&this->m_VulkanBLAS);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VulkanBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  this->m_MemoryAlignedOffset = 0;
  this_01 = RenderDeviceVkImpl::GetLogicalDevice(pRenderDeviceVk);
  this_02 = RenderDeviceVkImpl::GetPhysicalDevice(pRenderDeviceVk);
  pGVar10 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                      ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRenderDeviceVk);
  vkBuildInfo.scratchData =
       (VkDeviceOrHostAddressKHR)
       (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
       .m_Desc.CompactedSize;
  if (vkBuildInfo.scratchData.deviceAddress == 0) {
    vkBuildInfo.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
    vkBuildInfo.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
    vkBuildInfo.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkBuildInfo.geometryCount = 0;
    vkBuildInfo._52_4_ = 0;
    vkBuildInfo.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkBuildInfo._28_4_ = 0;
    vkBuildInfo.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
    vkBuildInfo.pNext = (void *)0x0;
    vkBuildInfo.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
    vkBuildInfo.flags = 0;
    vkGeometries.
    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vkBuildInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkBuildInfo._4_4_ = 0;
    this_00 = &MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::vector((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
              *)this_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    vkSizeInfo.pNext = (void *)0x0;
    vkSizeInfo.accelerationStructureSize = 0;
    vkSizeInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkSizeInfo._4_4_ = 0;
    vkSizeInfo.updateScratchSize = 0;
    i = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;
    MaxPrimitiveCount = 0;
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::resize((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
              *)this_00,(ulong)Desc->TriangleCount + (ulong)Desc->BoxCount);
    sVar11 = std::
             vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
             ::size((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                     *)&MaxPrimitiveCounts.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,sVar11);
    if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
        .m_Desc.pTriangles == (BLASTriangleDesc *)0x0) {
      if ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
          .m_Desc.pBoxes == (BLASBoundingBoxDesc *)0x0) {
        FormatString<char[45]>
                  ((string *)((long)&msg_5.field_2 + 8),
                   (char (*) [45])"Either pTriangles or pBoxes must not be null");
        pCVar13 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar13,"BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x81);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
      else {
        src_1._4_4_ = 0;
        for (src_1._0_4_ = 0; uVar5 = (uint)src_1,
            (uint)src_1 <
            (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
            .m_Desc.BoxCount; src_1._0_4_ = (uint)src_1 + 1) {
          pBVar3 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                   .m_Desc.pBoxes;
          pvVar12 = std::
                    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ::operator[]((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                  *)&MaxPrimitiveCounts.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)(uint)src_1);
          pvVar12->sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
          pvVar12->pNext = (void *)0x0;
          pvVar12->geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;
          (pvVar12->geometry).triangles.sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
          (pvVar12->geometry).triangles.pNext = (void *)0x0;
          vVar1 = pBVar3[uVar5].MaxBoxCount;
          pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                               (ulong)(uint)src_1);
          *pvVar14 = vVar1;
          src_1._4_4_ = pBVar3[uVar5].MaxBoxCount + src_1._4_4_;
        }
        if ((pGVar10->RayTracing).MaxPrimitivesPerBLAS < src_1._4_4_) {
          FormatString<char[16],unsigned_int,char[25],unsigned_int,char[2]>
                    ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Max box count (",
                     (char (*) [16])((long)&src_1 + 4),(uint *)") exceeds device limit (",
                     (char (*) [25])&(pGVar10->RayTracing).MaxPrimitivesPerBLAS,(uint *)0xcabce5,
                     (char (*) [2])in_stack_fffffffffffffb48);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x7c);
          std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
        }
      }
    }
    else {
      src._4_4_ = 0;
      for (src._0_4_ = 0; uVar5 = (uint)src,
          (uint)src <
          (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
          .m_Desc.TriangleCount; src._0_4_ = (uint)src + 1) {
        pBVar2 = (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                 .m_Desc.pTriangles;
        pvVar12 = std::
                  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                  ::operator[]((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                                *)&MaxPrimitiveCounts.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)(uint)src);
        pvVar12->sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        pvVar12->pNext = (void *)0x0;
        pvVar12->geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
        pvVar12->flags = 0;
        (pvVar12->geometry).triangles.sType =
             VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
        (pvVar12->geometry).triangles.pNext = (void *)0x0;
        VVar7 = TypeToVkFormat(pBVar2[uVar5].VertexValueType,
                               (uint)pBVar2[uVar5].VertexComponentCount,
                               pBVar2[uVar5].VertexValueType < VT_FLOAT16);
        (pvVar12->geometry).triangles.vertexFormat = VVar7;
        if (pBVar2[uVar5].MaxVertexCount == 0) {
          FormatString<char[38]>
                    ((string *)&vkProps.formatProperties.bufferFeatures,
                     (char (*) [38])"MaxVertexCount must be greater than 0");
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x4b);
          std::__cxx11::string::~string((string *)&vkProps.formatProperties.bufferFeatures);
        }
        (pvVar12->geometry).triangles.maxVertex = pBVar2[uVar5].MaxVertexCount - 1;
        VVar8 = TypeToVkIndexType(pBVar2[uVar5].IndexType);
        (pvVar12->geometry).triangles.indexType = VVar8;
        *(ulong *)((long)&pvVar12->geometry + 0x38) = (ulong)(pBVar2[uVar5].AllowsTransforms & 1);
        vVar1 = pBVar2[uVar5].MaxPrimitiveCount;
        pvVar14 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8,
                             (ulong)(uint)src);
        *pvVar14 = vVar1;
        p_Var4 = vkGetPhysicalDeviceFormatProperties2KHR;
        src._4_4_ = src._4_4_ + pBVar2[uVar5].MaxPrimitiveCount;
        vkProps.pNext = (void *)0x0;
        vkProps.formatProperties.linearTilingFeatures = 0;
        vkProps.formatProperties.optimalTilingFeatures = 0;
        vkProps.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        vkProps._4_4_ = 0;
        msg_1.field_2._8_8_ = 0x3b9bb07a;
        pVVar15 = VulkanUtilities::VulkanPhysicalDevice::GetVkDeviceHandle(this_02);
        (*p_Var4)(pVVar15,(pvVar12->geometry).triangles.vertexFormat,
                  (VkFormatProperties2 *)((long)&msg_1.field_2 + 8));
        if ((vkProps.formatProperties._0_8_ & 0x20000000) == 0) {
          msg_2.field_2._8_8_ = GetValueTypeString(pBVar2[uVar5].VertexValueType);
          in_stack_fffffffffffffb48 = (char (*) [27])&src;
          FormatString<char[27],unsigned_int,char[20],char_const*,char[18],unsigned_int,char[25],unsigned_char,char[35]>
                    ((string *)local_188,(Diligent *)"combination of pTriangles[",
                     in_stack_fffffffffffffb48,(uint *)"].VertexValueType (",
                     (char (*) [20])((long)&msg_2.field_2 + 8),(char **)") and pTriangles[",
                     (char (*) [18])in_stack_fffffffffffffb48,(uint *)"].VertexComponentCount (",
                     (char (*) [25])&pBVar2[uVar5].VertexComponentCount,
                     (uchar *)") is not supported by this device.",in_stack_fffffffffffffb68);
          pCVar13 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar13,"BottomLevelASVkImpl",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                     ,0x5d);
          std::__cxx11::string::~string((string *)local_188);
        }
      }
      if ((pGVar10->RayTracing).MaxPrimitivesPerBLAS < src._4_4_) {
        FormatString<char[23],unsigned_int,char[25],unsigned_int,char[2]>
                  ((string *)&i_1,(Diligent *)"Max primitives count (",
                   (char (*) [23])((long)&src + 4),(uint *)") exceeds device limit (",
                   (char (*) [25])&(pGVar10->RayTracing).MaxPrimitivesPerBLAS,(uint *)0xcabce5,
                   (char (*) [2])in_stack_fffffffffffffb48);
        pCVar13 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar13,"BottomLevelASVkImpl",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                   ,0x65);
        std::__cxx11::string::~string((string *)&i_1);
      }
    }
    vkGeometries.
    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(vkGeometries.
                           super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0x3b9d13f0);
    VVar9 = BuildASFlagsToVkBuildAccelerationStructureFlags
                      ((this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                       .m_Desc.Flags);
    vkBuildInfo.pNext = (void *)CONCAT44(VVar9,1);
    vkBuildInfo._48_8_ =
         std::
         vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
         ::data((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 *)&MaxPrimitiveCounts.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    sVar11 = std::
             vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
             ::size((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                     *)&MaxPrimitiveCounts.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    vkBuildInfo.dstAccelerationStructure =
         (VkAccelerationStructureKHR)
         CONCAT44(vkBuildInfo.dstAccelerationStructure._4_4_,(uint)sVar11);
    if ((pGVar10->RayTracing).MaxGeometriesPerBLAS < (uint)sVar11) {
      FormatString<char[17],unsigned_int,char[25],unsigned_int,char[3]>
                ((string *)&vkBuffCI.pQueueFamilyIndices,(Diligent *)"Geometry count (",
                 (char (*) [17])&vkBuildInfo.dstAccelerationStructure,
                 (uint *)") exceeds device limit (",
                 (char (*) [25])&(pGVar10->RayTracing).MaxGeometriesPerBLAS,(uint *)0xccce78,
                 (char (*) [3])in_stack_fffffffffffffb48);
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"BottomLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
                 ,0x8b);
      std::__cxx11::string::~string((string *)&vkBuffCI.pQueueFamilyIndices);
    }
    pMaxPrimitiveCounts =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
              (this_01,(VkAccelerationStructureBuildGeometryInfoKHR *)
                       &vkGeometries.
                        super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pMaxPrimitiveCounts,
               (VkAccelerationStructureBuildSizesInfoKHR *)&i);
    vkBuildInfo.scratchData.hostAddress = vkSizeInfo.pNext;
    (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Build =
         vkSizeInfo.updateScratchSize;
    (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Update =
         vkSizeInfo.accelerationStructureSize;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d8);
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::~vector((vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
               *)&MaxPrimitiveCounts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  vkBuffCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuffCI._4_4_ = 0;
  auStack_268 = (undefined1  [8])0xc;
  vkBuffCI.pNext = (void *)0x0;
  vkBuffCI._16_8_ = vkBuildInfo.scratchData;
  vkBuffCI.size =
       (long)
       "_ZNSt10_HashtableIiSt4pairIKiPKcESaIS4_ENSt8__detail10_Select1stESt8equal_toIiESt4hashIiENS6_18_Mod_range_hashingENS6_20_Default_ranged_hashENS6_20_Prime_rehash_policyENS6_17_Hashtable_traitsILb0ELb0ELb1EEEED2Ev"
       + 0xbc;
  vkBuffCI.usage = 0;
  vkBuffCI.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vkBuffCI.queueFamilyIndexCount = 0;
  vkBuffCI._44_4_ = 0;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&MemReqs.memoryTypeBits,this_01,(VkBufferCreateInfo *)auStack_268,
             (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VulkanBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &MemReqs.memoryTypeBits);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &MemReqs.memoryTypeBits);
  pVVar16 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                      ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)auStack_298,this_01,pVVar16);
  msg_6.field_2._12_4_ =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                 (this_02,(uint32_t)MemReqs.alignment,1);
  bVar6 = IsPowerOfTwo<unsigned_long>(MemReqs.size);
  if (!bVar6) {
    FormatString<char[29]>((string *)local_2c0,(char (*) [29])"Alignment is not power of 2!");
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)local_2c0);
  }
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)((long)&msg_7.field_2 + 8),pRenderDeviceVk,_auStack_298,
             MemReqs.size,msg_6.field_2._12_4_,2);
  rhs = (VulkanMemoryAllocation *)((long)&msg_7.field_2 + 8);
  VulkanUtilities::VulkanMemoryAllocation::operator=(&this->m_MemoryAllocation,rhs);
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(rhs);
  bVar6 = VulkanUtilities::VulkanMemoryAllocation::operator_cast_to_bool(&this->m_MemoryAllocation);
  if (!bVar6) {
    LogError<true,char[37],char_const*,char[3]>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa5,(char (*) [37])"Failed to allocate memory for BLAS \'",
               (char **)&(this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                         .m_Desc,(char (*) [3])"\'.");
  }
  tVar17 = AlignUp<unsigned_long,unsigned_long>
                     ((this->m_MemoryAllocation).UnalignedOffset,MemReqs.size);
  this->m_MemoryAlignedOffset = tVar17;
  if ((this->m_MemoryAllocation).Size <
      _auStack_298 + (this->m_MemoryAlignedOffset - (this->m_MemoryAllocation).UnalignedOffset)) {
    FormatString<char[39]>
              ((string *)&Memory,(char (*) [39])"Size of memory allocation is too small");
    pCVar13 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar13,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xa8);
    std::__cxx11::string::~string((string *)&Memory);
  }
  pVStack_300 = VulkanUtilities::VulkanMemoryPage::GetVkMemory((this->m_MemoryAllocation).Page);
  pVVar16 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                      ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  local_304 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_01,pVVar16,pVStack_300,this->m_MemoryAlignedOffset);
  if (local_304 != VK_SUCCESS) {
    local_310 = VulkanUtilities::VkResultToString(local_304);
    LogError<true,char[29],char[17],char_const*>
              (false,"BottomLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/BottomLevelASVkImpl.cpp"
               ,0xab,(char (*) [29])"Failed to bind buffer memory",
               (char (*) [17])"\nVK Error Code: ",&local_310);
  }
  vkAccelStrCI.size = 0;
  vkAccelStrCI.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkAccelStrCI._52_4_ = 0;
  vkAccelStrCI.buffer = (VkBuffer)0x0;
  vkAccelStrCI.offset = 0;
  vkAccelStrCI.createFlags = 0;
  vkAccelStrCI._20_4_ = 0;
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkAccelStrCI._4_4_ = 0;
  auStack_358 = (undefined1  [8])0x3b9d1401;
  vkAccelStrCI.pNext = (void *)0x0;
  vkAccelStrCI._16_8_ =
       VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                 ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  vkAccelStrCI.buffer = (VkBuffer)0x0;
  vkAccelStrCI.offset = vkBuildInfo.scratchData.deviceAddress;
  vkAccelStrCI.size = CONCAT44(vkAccelStrCI.size._4_4_,1);
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            (&local_370,this_01,(VkAccelerationStructureCreateInfoKHR *)auStack_358,
             (this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(&this->m_VulkanBLAS,&local_370);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper(&local_370);
  AS = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkAccelerationStructureKHR_T_
                 ((VulkanObjectWrapper *)&this->m_VulkanBLAS);
  VVar18 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress(this_01,AS);
  this->m_DeviceAddress = VVar18;
  BottomLevelASBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
             RESOURCE_STATE_BUILD_AS_READ);
  return;
}

Assistant:

BottomLevelASVkImpl::BottomLevelASVkImpl(IReferenceCounters*      pRefCounters,
                                         RenderDeviceVkImpl*      pRenderDeviceVk,
                                         const BottomLevelASDesc& Desc) :
    TBottomLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureBuildGeometryInfoKHR     vkBuildInfo{};
        std::vector<VkAccelerationStructureGeometryKHR> vkGeometries;
        std::vector<uint32_t>                           MaxPrimitiveCounts;
        VkAccelerationStructureBuildSizesInfoKHR        vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        vkGeometries.resize(size_t{Desc.TriangleCount} + size_t{Desc.BoxCount});
        MaxPrimitiveCounts.resize(vkGeometries.size());

        if (m_Desc.pTriangles != nullptr)
        {
            Uint32 MaxPrimitiveCount = 0;
            for (uint32_t i = 0; i < m_Desc.TriangleCount; ++i)
            {
                auto& src = m_Desc.pTriangles[i];
                auto& dst = vkGeometries[i];
                auto& tri = dst.geometry.triangles;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
                dst.flags        = 0;

                tri.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
                tri.pNext        = nullptr;
                tri.vertexFormat = TypeToVkFormat(src.VertexValueType, src.VertexComponentCount, src.VertexValueType < VT_FLOAT16);
                // maxVertex is the number of vertices in vertexData minus one.
                VERIFY(src.MaxVertexCount > 0, "MaxVertexCount must be greater than 0");
                tri.maxVertex = src.MaxVertexCount - 1;
                tri.indexType = TypeToVkIndexType(src.IndexType);
                // Non-null address indicates that non-null transform data will be provided to the build command.
                tri.transformData.deviceAddress = src.AllowsTransforms ? 1 : 0;
                MaxPrimitiveCounts[i]           = src.MaxPrimitiveCount;

                MaxPrimitiveCount += src.MaxPrimitiveCount;

#ifdef DILIGENT_DEVELOPMENT
#    if DILIGENT_USE_VOLK
                {
                    VkFormatProperties2 vkProps{};
                    vkProps.sType = VK_STRUCTURE_TYPE_FORMAT_PROPERTIES_2;
                    vkGetPhysicalDeviceFormatProperties2KHR(PhysicalDevice.GetVkDeviceHandle(), tri.vertexFormat, &vkProps);

                    DEV_CHECK_ERR((vkProps.formatProperties.bufferFeatures & VK_FORMAT_FEATURE_ACCELERATION_STRUCTURE_VERTEX_BUFFER_BIT_KHR) != 0,
                                  "combination of pTriangles[", i, "].VertexValueType (", GetValueTypeString(src.VertexValueType),
                                  ") and pTriangles[", i, "].VertexComponentCount (", src.VertexComponentCount, ") is not supported by this device.");
                }
#    else
                UNSUPPORTED("vkGetPhysicalDeviceFormatProperties2KHR is only available through Volk");
#    endif
#endif
            }
            DEV_CHECK_ERR(MaxPrimitiveCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max primitives count (", MaxPrimitiveCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxPrimitiveCount;
        }
        else if (m_Desc.pBoxes != nullptr)
        {
            Uint32 MaxBoxCount = 0;
            for (uint32_t i = 0; i < m_Desc.BoxCount; ++i)
            {
                auto& src = m_Desc.pBoxes[i];
                auto& dst = vkGeometries[i];
                auto& box = dst.geometry.aabbs;

                dst.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
                dst.pNext        = nullptr;
                dst.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

                box.sType             = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
                box.pNext             = nullptr;
                MaxPrimitiveCounts[i] = src.MaxBoxCount;

                MaxBoxCount += src.MaxBoxCount;
            }
            DEV_CHECK_ERR(MaxBoxCount <= RTProps.MaxPrimitivesPerBLAS,
                          "Max box count (", MaxBoxCount, ") exceeds device limit (", RTProps.MaxPrimitivesPerBLAS, ")");
            (void)MaxBoxCount;
        }
        else
        {
            UNEXPECTED("Either pTriangles or pBoxes must not be null");
        }

        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
        vkBuildInfo.pGeometries   = vkGeometries.data();
        vkBuildInfo.geometryCount = static_cast<uint32_t>(vkGeometries.size());

        DEV_CHECK_ERR(vkBuildInfo.geometryCount <= RTProps.MaxGeometriesPerBLAS, "Geometry count (", vkBuildInfo.geometryCount,
                      ") exceeds device limit (", RTProps.MaxGeometriesPerBLAS, ").");

        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, MaxPrimitiveCounts.data(), vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for BLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;

    m_VulkanBLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanBLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}